

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O3

void Abc_NtkManCutStop(Abc_ManCut_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Vec_t *__ptr;
  void *__ptr_00;
  int iVar3;
  long lVar4;
  
  pVVar1 = p->vNodeLeaves;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vConeLeaves;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vVisited;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  __ptr = p->vLevels;
  iVar3 = __ptr->nSize;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      __ptr_00 = __ptr->pArray[lVar4];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
        }
        free(__ptr_00);
        iVar3 = __ptr->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  pVVar1 = p->vNodesTfo;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  free(p);
  return;
}

Assistant:

void Abc_NtkManCutStop( Abc_ManCut_t * p )
{
    Vec_PtrFree( p->vNodeLeaves );
    Vec_PtrFree( p->vConeLeaves );
    Vec_PtrFree( p->vVisited    );
    Vec_VecFree( p->vLevels );
    Vec_PtrFree( p->vNodesTfo );
    ABC_FREE( p );
}